

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O1

ReadFileResult
cmCMakePresetsGraphInternal::PresetVectorStringHelper
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *out,Value *value)

{
  ReadFileResult RVar1;
  int iVar2;
  undefined8 *puVar3;
  Value *local_18;
  
  if (PresetVectorStringHelper(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,Json::Value_const*)
      ::helper_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&PresetVectorStringHelper(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,Json::Value_const*)
                                 ::helper_abi_cxx11_);
    if (iVar2 != 0) {
      PresetVectorStringHelper(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,Json::Value_const*)
      ::helper_abi_cxx11_.super__Function_base._M_manager = (_Manager_type)0x0;
      PresetVectorStringHelper(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,Json::Value_const*)
      ::helper_abi_cxx11_._M_invoker = (_Invoker_type)0x0;
      PresetVectorStringHelper(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,Json::Value_const*)
      ::helper_abi_cxx11_.super__Function_base._M_functor = (_Any_data)ZEXT816(0);
      puVar3 = (undefined8 *)operator_new(0x18);
      *puVar3 = 0xa00000000;
      puVar3[1] = PresetStringHelper;
      PresetVectorStringHelper(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,Json::Value_const*)
      ::helper_abi_cxx11_.super__Function_base._M_functor._M_unused._M_object = puVar3;
      PresetVectorStringHelper(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,Json::Value_const*)
      ::helper_abi_cxx11_._M_invoker =
           std::
           _Function_handler<cmCMakePresetsGraph::ReadFileResult_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmJSONHelpers.h:204:12)>
           ::_M_invoke;
      PresetVectorStringHelper(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,Json::Value_const*)
      ::helper_abi_cxx11_.super__Function_base._M_manager =
           std::
           _Function_handler<cmCMakePresetsGraph::ReadFileResult_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmJSONHelpers.h:204:12)>
           ::_M_manager;
      __cxa_atexit(std::_Function_base::~_Function_base,
                   &PresetVectorStringHelper(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,Json::Value_const*)
                    ::helper_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&PresetVectorStringHelper(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,Json::Value_const*)
                           ::helper_abi_cxx11_);
    }
  }
  local_18 = value;
  if (PresetVectorStringHelper(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,Json::Value_const*)
      ::helper_abi_cxx11_.super__Function_base._M_manager != (_Manager_type)0x0) {
    RVar1 = (*PresetVectorStringHelper(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,Json::Value_const*)
              ::helper_abi_cxx11_._M_invoker)
                      ((_Any_data *)
                       &PresetVectorStringHelper(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,Json::Value_const*)
                        ::helper_abi_cxx11_,out,&local_18);
    return RVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

cmCMakePresetsGraph::ReadFileResult PresetVectorStringHelper(
  std::vector<std::string>& out, const Json::Value* value)
{
  static auto const helper = JSONHelperBuilder::Vector<std::string>(
    ReadFileResult::READ_OK, ReadFileResult::INVALID_PRESET,
    cmCMakePresetsGraphInternal::PresetStringHelper);

  return helper(out, value);
}